

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

string * __thiscall pbrt::SampledSpectrum::ToString_abi_cxx11_(SampledSpectrum *this)

{
  array<float,_4> *in_RSI;
  string *in_RDI;
  int i;
  string *str;
  allocator<char> *args;
  char *in_stack_ffffffffffffffb8;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  int local_28;
  allocator<char> local_12;
  undefined1 local_11;
  
  local_11 = 0;
  args = &local_12;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator(&local_12);
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    pstd::array<float,_4>::operator[](in_RSI,(long)local_28);
    StringPrintf<float_const&>(in_stack_ffffffffffffffb8,(float *)args);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffffb8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    if (local_28 + 1 < 4) {
      std::__cxx11::string::operator+=((string *)in_RDI,", ");
    }
  }
  std::__cxx11::string::operator+=((string *)in_RDI," ]");
  return in_RDI;
}

Assistant:

std::string SampledSpectrum::ToString() const {
    std::string str = "[ ";
    for (int i = 0; i < NSpectrumSamples; ++i) {
        str += StringPrintf("%f", values[i]);
        if (i + 1 < NSpectrumSamples)
            str += ", ";
    }
    str += " ]";
    return str;
}